

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_getenv(lua_State *L)

{
  char *pcVar1;
  lua_State *L_local;
  
  pcVar1 = luaL_checklstring(L,1,(size_t *)0x0);
  pcVar1 = getenv(pcVar1);
  lua_pushstring(L,pcVar1);
  return 1;
}

Assistant:

LJLIB_CF(os_getenv)
{
#if LJ_TARGET_CONSOLE
  lua_pushnil(L);
#else
  lua_pushstring(L, getenv(luaL_checkstring(L, 1)));  /* if NULL push nil */
#endif
  return 1;
}